

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void add_reset(ROOM_INDEX_DATA *room,RESET_DATA *pReset,int index)

{
  int iReset;
  RESET_DATA *reset;
  int index_local;
  RESET_DATA *pReset_local;
  ROOM_INDEX_DATA *room_local;
  
  iReset = 0;
  if (room->reset_first == (RESET_DATA *)0x0) {
    room->reset_first = pReset;
    room->reset_last = pReset;
    pReset->next = (RESET_DATA *)0x0;
  }
  else if (index == 1) {
    pReset->next = room->reset_first;
    room->reset_first = pReset;
  }
  else {
    reset = room->reset_first;
    while ((reset->next != (RESET_DATA *)0x0 && (iReset = iReset + 1, iReset != index + -1))) {
      reset = reset->next;
    }
    pReset->next = reset->next;
    reset->next = pReset;
    if (pReset->next == (RESET_DATA *)0x0) {
      room->reset_last = pReset;
    }
  }
  return;
}

Assistant:

void add_reset(ROOM_INDEX_DATA *room, RESET_DATA *pReset, int index)
{
	RESET_DATA *reset;
	int iReset = 0;

	if (!room->reset_first)
	{
		room->reset_first = pReset;
		room->reset_last = pReset;
		pReset->next = nullptr;
		return;
	}

	index--;

	if (index == 0) /* First slot (1) selected. */
	{
		pReset->next = room->reset_first;
		room->reset_first = pReset;
		return;
	}

	/*
	 * If negative slot( <= 0 selected) then this will find the last.
	 */
	for (reset = room->reset_first; reset->next; reset = reset->next)
	{
		if (++iReset == index)
			break;
	}

	pReset->next = reset->next;
	reset->next = pReset;

	if (!pReset->next)
		room->reset_last = pReset;

	return;
}